

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

void __thiscall FNodeBuilder::PrintSet(FNodeBuilder *this,int l,DWORD set)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FPrivSeg *pFVar6;
  long lVar7;
  FPrivVert *pFVar8;
  char local_31;
  uint local_28;
  DWORD set_local;
  int l_local;
  FNodeBuilder *this_local;
  
  Printf(5,"set %d:\n",(ulong)(uint)l);
  local_28 = set;
  while (local_28 != 0xffffffff) {
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    lVar7 = (long)pFVar6->frontsector - (long)sectors;
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    local_31 = '+';
    if (pFVar6->linedef != -1) {
      local_31 = ':';
    }
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    uVar1 = pFVar6->v1;
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar6->v1);
    iVar2 = (pFVar8->super_FSimpleVert).x;
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar6->v1);
    iVar3 = (pFVar8->super_FSimpleVert).y;
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    iVar4 = pFVar6->v2;
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar6->v2);
    iVar5 = (pFVar8->super_FSimpleVert).x;
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar6->v2);
    Printf(5,"\t%u(%td)%c%d(%d,%d)-%d(%d,%d)\n",(ulong)local_28,lVar7 / 0x268,
           (ulong)(uint)(int)local_31,(ulong)uVar1,iVar2 >> 0x10,iVar3 >> 0x10,iVar4,iVar5 >> 0x10,
           (pFVar8->super_FSimpleVert).y >> 0x10);
    pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_28);
    local_28 = pFVar6->next;
  }
  Printf(5,"*\n");
  return;
}

Assistant:

void FNodeBuilder::PrintSet (int l, DWORD set)
{
	Printf (PRINT_LOG, "set %d:\n", l);
	for (; set != DWORD_MAX; set = Segs[set].next)
	{
		Printf (PRINT_LOG, "\t%u(%td)%c%d(%d,%d)-%d(%d,%d)\n", set, Segs[set].frontsector-sectors,
			Segs[set].linedef == -1 ? '+' : ':',
			Segs[set].v1,
			Vertices[Segs[set].v1].x>>16, Vertices[Segs[set].v1].y>>16,
			Segs[set].v2,
			Vertices[Segs[set].v2].x>>16, Vertices[Segs[set].v2].y>>16);
	}
	Printf (PRINT_LOG, "*\n");
}